

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel_sse.c
# Opt level: O1

void uavs3d_conv_fmt_8bit_sse
               (uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
               int src_stridec,int *dst_stride,int uv_shift)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uchar *__dest;
  int iVar9;
  undefined1 auVar10 [16];
  
  puVar4 = dst[1];
  puVar3 = dst[2];
  if (0 < height) {
    __dest = *dst;
    iVar9 = height;
    do {
      memcpy(__dest,src_y,(long)width);
      src_y = src_y + src_stride;
      __dest = __dest + *dst_stride;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  auVar2 = _DAT_0018d6b0;
  iVar9 = height >> ((byte)uv_shift & 0x1f);
  if (0 < iVar9) {
    uVar1 = (width >> ((byte)uv_shift & 0x1f)) * 2;
    iVar5 = 0;
    do {
      uVar6 = 0;
      if (0 < (int)(uVar1 & 0xfffffff0)) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          auVar10 = pshufb(*(undefined1 (*) [16])(src_uv + lVar7 * 2),auVar2);
          *(long *)(puVar4 + lVar7) = auVar10._0_8_;
          *(long *)(puVar3 + lVar7) = auVar10._8_8_;
          uVar6 = uVar6 + 0x10;
          lVar7 = lVar7 + 8;
        } while ((long)uVar6 < (long)(int)(uVar1 & 0xfffffff0));
      }
      if ((int)(uint)uVar6 < (int)uVar1) {
        uVar8 = uVar6 & 0xffffffff;
        uVar6 = (ulong)((uint)uVar6 >> 1);
        do {
          puVar4[uVar6] = src_uv[uVar8];
          puVar3[uVar6] = src_uv[uVar8 + 1];
          uVar8 = uVar8 + 2;
          uVar6 = uVar6 + 1;
        } while ((long)uVar8 < (long)(int)uVar1);
      }
      src_uv = src_uv + src_stridec;
      puVar4 = puVar4 + dst_stride[1];
      puVar3 = puVar3 + dst_stride[2];
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar9);
  }
  return;
}

Assistant:

void uavs3d_conv_fmt_8bit_sse(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift)
{
    __m128i uv_mask = _mm_set1_epi16(0xff), msrc, msrcu, msrcv;
    unsigned char* p_src = src_y;
    unsigned char* p_dst_y = dst[0];
    unsigned char* p_dst_u = dst[1];
    unsigned char* p_dst_v = dst[2];
    int i, j, j2;
    int width16;
    for (i = 0; i < height; i++) {
        memcpy(p_dst_y, p_src, width);
        p_src += src_stride;
        p_dst_y += dst_stride[0];
    }
    width >>= uv_shift;
    height >>= uv_shift;

    p_src = src_uv;
    width <<= 1;
    width16 = (width >> 4) << 4;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width16; j += 16) {
            j2 = j >> 1;
            msrc = _mm_loadu_si128((const __m128i*)(p_src + j));
            msrcu = _mm_and_si128(msrc, uv_mask);
            msrcv = _mm_and_si128(_mm_srli_si128(msrc, 1), uv_mask);
            msrc = _mm_packus_epi16(msrcu, msrcv);
            _mm_storel_epi64((__m128i*)(p_dst_u + j2), msrc);
            _mm_storel_epi64((__m128i*)(p_dst_v + j2), _mm_srli_si128(msrc, 8));
        }
        for (; j < width; j += 2) {
            p_dst_u[j >> 1] = p_src[j];
            p_dst_v[j >> 1] = p_src[j + 1];
        }
        p_src += src_stridec;
        p_dst_u += dst_stride[1];
        p_dst_v += dst_stride[2];
    }
}